

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O2

void __thiscall verona::Options::configure(Options *this,App *cli)

{
  allocator<char> local_52;
  allocator<char> local_51;
  string local_50;
  string local_30;
  
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"--no-std",&local_51);
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"Don\'t import the standard library.",&local_52);
  CLI::App::add_flag<bool,_(CLI::detail::enabler)0>(cli,&local_30,&this->no_std,&local_50);
  ::std::__cxx11::string::~string((string *)&local_50);
  ::std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void Options::configure(CLI::App& cli)
  {
    cli.add_flag("--no-std", no_std, "Don't import the standard library.");
  }